

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderHelperInvocationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::FboHelper::bindForRendering(FboHelper *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  Functions *gl;
  FboHelper *this_local;
  long lVar5;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  pcVar1 = *(code **)(lVar5 + 0x78);
  dVar3 = glu::ObjectWrapper::operator*(&(this->m_framebuffer).super_ObjectWrapper);
  (*pcVar1)(0x8d40,dVar3);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glBindFramebuffer()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0x106);
  pcVar1 = *(code **)(lVar5 + 0x1a00);
  iVar2 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar4 = tcu::Vector<int,_2>::y(&this->m_size);
  (*pcVar1)(0,0,iVar2,iVar4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"viewport()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderHelperInvocationTests.cpp"
                  ,0x108);
  return;
}

Assistant:

void FboHelper::bindForRendering (void)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();
	gl.bindFramebuffer(GL_FRAMEBUFFER, *m_framebuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");
	gl.viewport(0, 0, m_size.x(), m_size.y());
	GLU_EXPECT_NO_ERROR(gl.getError(), "viewport()");
}